

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QLinuxFbDevice::Output>::relocate
          (QArrayDataPointer<QLinuxFbDevice::Output> *this,qsizetype offset,Output **data)

{
  bool bVar1;
  Output *in_RDX;
  long in_RSI;
  Output *in_RDI;
  Output **unaff_retaddr;
  Output *res;
  char16_t *n;
  Output *c;
  
  n = (in_RDI->kmsOutput).name.d.ptr + in_RSI * 0xb8;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QLinuxFbDevice::Output,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (Output *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QLinuxFbDevice::Output>,QLinuxFbDevice::Output_const*>
                        (unaff_retaddr,(QArrayDataPointer<QLinuxFbDevice::Output> *)c), bVar1)) {
    (in_RDX->kmsOutput).name.d.d = (in_RDX->kmsOutput).name.d.d + in_RSI * 0x17;
  }
  (in_RDI->kmsOutput).name.d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }